

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::appendInt(Builder *this,int64_t v,uint8_t base)

{
  Builder *this_00;
  Builder *in_RSI;
  Builder *in_RDI;
  int64_t shift;
  uint64_t x;
  uint8_t vSize;
  Builder *in_stack_ffffffffffffffc8;
  uint8_t value;
  ValueLength in_stack_ffffffffffffffd8;
  uint8_t local_12;
  
  local_12 = intLength((int64_t)in_RSI);
  if (local_12 == '\b') {
    this_00 = (Builder *)toUInt64((int64_t)in_RSI);
    in_RSI = in_stack_ffffffffffffffc8;
  }
  else {
    in_stack_ffffffffffffffd8 = 1L << (local_12 * '\b' - 1 & 0x3f);
    this_00 = in_RSI;
    if ((long)in_RSI < 0) {
      in_RSI = (Builder *)((in_RSI->_arena).buf_ + in_stack_ffffffffffffffd8 * 2 + -0x28);
      this_00 = in_RSI;
    }
  }
  reserve(this_00,in_stack_ffffffffffffffd8);
  value = (uint8_t)((ulong)in_RSI >> 0x38);
  appendByteUnchecked(in_RDI,value);
  while (local_12 != '\0') {
    appendByteUnchecked(in_RDI,value);
    local_12 = local_12 + 0xff;
  }
  return;
}

Assistant:

void appendInt(int64_t v, uint8_t base) {
    uint8_t vSize = intLength(v);
    uint64_t x;
    if (vSize == 8) {
      x = toUInt64(v);
    } else {
      int64_t shift = 1LL << (vSize * 8 - 1);  // will never overflow!
      x = v >= 0 ? static_cast<uint64_t>(v)
                 : static_cast<uint64_t>(v + shift) + shift;
    }
    reserve(1 + vSize);
    appendByteUnchecked(base + vSize);
    while (vSize-- > 0) {
      appendByteUnchecked(x & 0xff);
      x >>= 8;
    }
  }